

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

bool __thiscall
RtApiPulse::probeDeviceOpen
          (RtApiPulse *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  CallbackInfo *__arg;
  pointer pPVar1;
  StreamMode SVar2;
  pointer pDVar3;
  pointer pPVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  undefined8 *puVar10;
  int *piVar11;
  char *pcVar12;
  ulong uVar13;
  uint *puVar14;
  RtAudioFormat RVar15;
  RtAudioFormat RVar16;
  uint uVar17;
  rtaudio_pa_format_mapping_t *prVar18;
  long lVar19;
  ulong uVar20;
  pointer pcVar21;
  _Alloc_hider _Var22;
  uint uVar23;
  long *plVar24;
  size_t __nmemb;
  byte bVar25;
  int i;
  bool bVar26;
  int error;
  pa_sample_format_t local_b4;
  uint local_b0;
  undefined1 local_ac;
  string streamName;
  sched_param param;
  int local_7c [5];
  pthread_attr_t attr;
  
  pDVar3 = (this->super_RtApi).deviceList_.
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar19 = (long)(this->super_RtApi).deviceList_.
                 super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pDVar3;
  uVar23 = 0xffffffff;
  if (lVar19 != 0) {
    uVar13 = (lVar19 >> 5) * -0x5555555555555555;
    uVar20 = 0;
    do {
      uVar23 = (uint)uVar20;
      if (pDVar3[uVar20].ID == deviceId) break;
      uVar20 = (ulong)((uint)uVar20 + 1);
      uVar23 = 0xffffffff;
    } while (uVar20 <= uVar13 && uVar13 - uVar20 != 0);
  }
  if ((int)uVar23 < 0) {
    bVar25 = 0;
    goto LAB_0011082c;
  }
  if (firstChannel == 0) {
    pPVar4 = (this->paDeviceList_).
             super__Vector_base<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar1 = pPVar4 + uVar23;
    if (pPVar4[uVar23].sourceName._M_string_length == 0) {
      pcVar21 = (pointer)0x0;
    }
    else {
      pcVar21 = (pPVar1->sourceName)._M_dataplus._M_p;
    }
    if ((pPVar1->sinkName)._M_string_length == 0) {
      _Var22._M_p = (pointer)0x0;
    }
    else {
      _Var22._M_p = (pPVar1->sinkName)._M_dataplus._M_p;
    }
    if ((mode == INPUT) && (pDVar3[uVar23].inputChannels < channels)) {
      pcVar9 = (char *)(this->super_RtApi).errorText_._M_string_length;
      pcVar12 = "PulseAudio device does not support requested input channel count.";
    }
    else {
      if ((mode != OUTPUT) || (channels <= pDVar3[uVar23].outputChannels)) {
        local_ac = (undefined1)channels;
        uVar17 = 8000;
        puVar14 = SUPPORTED_SAMPLERATES;
        do {
          puVar14 = puVar14 + 1;
          if (uVar17 == sampleRate) break;
          uVar17 = *puVar14;
        } while (uVar17 != 0);
        (this->super_RtApi).stream_.sampleRate = sampleRate;
        RVar15 = 2;
        prVar18 = supported_sampleformats;
        do {
          prVar18 = prVar18 + 1;
          if (RVar15 == format) {
            local_b4 = prVar18[-1].pa_format;
            RVar16 = RVar15;
            goto LAB_00110953;
          }
          RVar15 = prVar18->rtaudio_format;
        } while (RVar15 != 0);
        local_b4 = PA_SAMPLE_FLOAT32LE;
        RVar15 = format;
        RVar16 = 0x10;
LAB_00110953:
        (this->super_RtApi).stream_.userFormat = RVar15;
        (this->super_RtApi).stream_.deviceFormat[mode] = RVar16;
        if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
          bVar26 = true;
        }
        else {
          bVar26 = false;
        }
        (this->super_RtApi).stream_.userInterleaved = bVar26;
        (this->super_RtApi).stream_.deviceInterleaved[mode] = true;
        uVar17 = 1;
        if (options != (StreamOptions *)0x0) {
          uVar17 = options->numberOfBuffers;
        }
        (this->super_RtApi).stream_.nBuffers = uVar17;
        (this->super_RtApi).stream_.doByteSwap[mode] = false;
        (this->super_RtApi).stream_.nUserChannels[mode] = channels;
        (this->super_RtApi).stream_.nDeviceChannels[mode] = channels;
        (this->super_RtApi).stream_.channelOffset[mode] = 0;
        streamName._M_dataplus._M_p = (pointer)&streamName.field_2;
        local_b0 = sampleRate;
        std::__cxx11::string::_M_construct<char_const*>((string *)&streamName,"RtAudio","");
        (this->super_RtApi).stream_.doConvertBuffer[mode] = false;
        bVar26 = (this->super_RtApi).stream_.userFormat !=
                 (this->super_RtApi).stream_.deviceFormat[mode];
        (this->super_RtApi).stream_.doConvertBuffer[mode] = bVar26;
        bVar26 = (this->super_RtApi).stream_.nUserChannels[mode] <
                 (this->super_RtApi).stream_.nDeviceChannels[mode] || bVar26;
        (this->super_RtApi).stream_.doConvertBuffer[mode] = bVar26;
        (this->super_RtApi).stream_.doConvertBuffer[mode] =
             (this->super_RtApi).stream_.userInterleaved !=
             (this->super_RtApi).stream_.deviceInterleaved[mode] || bVar26;
        uVar17 = (this->super_RtApi).stream_.nUserChannels[mode];
        uVar13 = (ulong)uVar17;
        uVar6 = *bufferSize;
        uVar5 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.userFormat);
        uVar5 = uVar6 * uVar17 * uVar5;
        pcVar9 = (char *)calloc((ulong)uVar5,1);
        (this->super_RtApi).stream_.userBuffer[mode] = pcVar9;
        if (pcVar9 == (char *)0x0) {
          plVar24 = (long *)0x0;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_RtApi).errorText_,0,
                     (char *)(this->super_RtApi).errorText_._M_string_length,0x11641c);
LAB_00110e23:
          if ((plVar24 != (long *)0x0) &&
             ((this->super_RtApi).stream_.callbackInfo.isRunning == true)) {
            pthread_cond_destroy((pthread_cond_t *)(plVar24 + 3));
            operator_delete(plVar24);
            (this->super_RtApi).stream_.apiHandle = (void *)0x0;
          }
          lVar19 = 0;
          do {
            pcVar9 = (this->super_RtApi).stream_.userBuffer[lVar19];
            if (pcVar9 != (char *)0x0) {
              free(pcVar9);
              (this->super_RtApi).stream_.userBuffer[lVar19] = (char *)0x0;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 == 1);
          pcVar9 = (this->super_RtApi).stream_.deviceBuffer;
          if (pcVar9 != (char *)0x0) {
            free(pcVar9);
            (this->super_RtApi).stream_.deviceBuffer = (char *)0x0;
          }
          (this->super_RtApi).stream_.state = STREAM_CLOSED;
          uVar13 = 0;
        }
        else {
          (this->super_RtApi).stream_.bufferSize = *bufferSize;
          if ((this->super_RtApi).stream_.doConvertBuffer[mode] == true) {
            uVar17 = (this->super_RtApi).stream_.nDeviceChannels[mode];
            uVar6 = RtApi::formatBytes(&this->super_RtApi,
                                       (this->super_RtApi).stream_.deviceFormat[mode]);
            uVar6 = uVar6 * uVar17;
            uVar13 = (ulong)uVar6;
            if ((((mode == INPUT) && ((this->super_RtApi).stream_.mode == OUTPUT)) &&
                ((this->super_RtApi).stream_.deviceBuffer != (char *)0x0)) &&
               (uVar17 = (this->super_RtApi).stream_.nDeviceChannels[0],
               uVar5 = RtApi::formatBytes(&this->super_RtApi,
                                          (this->super_RtApi).stream_.deviceFormat[0]),
               uVar6 <= uVar5 * uVar17)) {
              iVar8 = 0;
              __nmemb = uVar13;
            }
            else {
              __nmemb = *bufferSize * uVar13;
              pcVar9 = (this->super_RtApi).stream_.deviceBuffer;
              if (pcVar9 != (char *)0x0) {
                free(pcVar9);
              }
              pcVar9 = (char *)calloc(__nmemb,1);
              (this->super_RtApi).stream_.deviceBuffer = pcVar9;
              if (pcVar9 == (char *)0x0) {
                std::__cxx11::string::operator=
                          ((string *)&(this->super_RtApi).errorText_,
                           "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.");
                iVar8 = 0xb;
              }
              else {
                iVar8 = 0;
              }
            }
            uVar5 = (uint)__nmemb;
            if (iVar8 != 0xb) {
              if (iVar8 == 0) goto LAB_00110ba1;
              goto LAB_00110ea1;
            }
LAB_00110c9f:
            plVar24 = (long *)0x0;
            goto LAB_00110e23;
          }
LAB_00110ba1:
          (this->super_RtApi).stream_.deviceId[mode] = uVar23;
          if ((this->super_RtApi).stream_.doConvertBuffer[mode] == true) {
            RtApi::setConvertInfo(&this->super_RtApi,mode,0);
          }
          if ((this->super_RtApi).stream_.apiHandle == (void *)0x0) {
            puVar10 = (undefined8 *)operator_new(0x50);
            *(undefined1 *)(puVar10 + 9) = 0;
            *puVar10 = 0;
            puVar10[1] = 0;
            (this->super_RtApi).stream_.apiHandle = puVar10;
            iVar7 = 0;
            iVar8 = pthread_cond_init((pthread_cond_t *)(puVar10 + 3),(pthread_condattr_t *)0x0);
            if (iVar8 != 0) {
              iVar7 = 0xb;
              std::__cxx11::string::operator=
                        ((string *)&(this->super_RtApi).errorText_,
                         "RtApiPulse::probeDeviceOpen: error creating condition variable.");
            }
            if (iVar7 == 0xb) goto LAB_00110c9f;
            if (iVar7 != 0) goto LAB_00110ea1;
          }
          plVar24 = (long *)(this->super_RtApi).stream_.apiHandle;
          if ((options != (StreamOptions *)0x0) && ((options->streamName)._M_string_length != 0)) {
            std::__cxx11::string::_M_assign((string *)&streamName);
          }
          if (mode != OUTPUT) {
            if (mode == DUPLEX) {
              pcVar9 = "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.";
            }
            else {
              if (mode != INPUT) goto LAB_00110e23;
              if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
                local_7c[0] = uVar5 << 2;
              }
              else {
                local_7c[0] = (options->numberOfBuffers + 1) * uVar5;
              }
              local_7c[4] = uVar5;
              lVar19 = pa_simple_new(0,streamName._M_dataplus._M_p,2,pcVar21,"Record",&local_b4,0,
                                     local_7c,&error);
              plVar24[1] = lVar19;
              if (lVar19 != 0) goto LAB_00110d90;
              pcVar9 = "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.";
            }
            std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,pcVar9);
            goto LAB_00110e23;
          }
          if ((options == (StreamOptions *)0x0) || (options->numberOfBuffers == 0)) {
            piVar11 = (int *)0x0;
          }
          else {
            local_7c[0] = options->numberOfBuffers * uVar5;
            piVar11 = local_7c;
            local_7c[3] = 0xffffffff;
            local_7c[1] = -1;
            local_7c[2] = -1;
          }
          lVar19 = pa_simple_new(0,streamName._M_dataplus._M_p,1,_Var22._M_p,"Playback",&local_b4,0,
                                 piVar11,&error);
          *plVar24 = lVar19;
          if (lVar19 == 0) {
            std::__cxx11::string::operator=
                      ((string *)&(this->super_RtApi).errorText_,
                       "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.")
            ;
            goto LAB_00110e23;
          }
LAB_00110d90:
          SVar2 = (this->super_RtApi).stream_.mode;
          if ((SVar2 != UNINITIALIZED) && (bVar26 = SVar2 == mode, mode = DUPLEX, bVar26))
          goto LAB_00110e23;
          (this->super_RtApi).stream_.mode = mode;
          uVar13 = 1;
          if ((this->super_RtApi).stream_.callbackInfo.isRunning == false) {
            __arg = &(this->super_RtApi).stream_.callbackInfo;
            (this->super_RtApi).stream_.callbackInfo.object = this;
            (this->super_RtApi).stream_.state = STREAM_STOPPED;
            pthread_attr_init((pthread_attr_t *)&attr);
            pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
            if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
              pthread_attr_setschedpolicy((pthread_attr_t *)&attr,0);
            }
            else {
              (this->super_RtApi).stream_.callbackInfo.doRealtime = true;
              iVar8 = options->priority;
              iVar7 = sched_get_priority_min(2);
              param.sched_priority = sched_get_priority_max(2);
              if (iVar8 < param.sched_priority) {
                param.sched_priority = iVar8;
              }
              if (iVar8 < iVar7) {
                param.sched_priority = iVar7;
              }
              pthread_attr_setschedpolicy((pthread_attr_t *)&attr,2);
              pthread_attr_setscope((pthread_attr_t *)&attr,0);
              pthread_attr_setinheritsched((pthread_attr_t *)&attr,1);
              pthread_attr_setschedparam((pthread_attr_t *)&attr,(sched_param *)&param);
            }
            (this->super_RtApi).stream_.callbackInfo.isRunning = true;
            iVar8 = pthread_create((pthread_t *)(plVar24 + 2),(pthread_attr_t *)&attr,
                                   pulseaudio_callback,__arg);
            pthread_attr_destroy((pthread_attr_t *)&attr);
            if ((iVar8 != 0) &&
               (iVar8 = pthread_create((pthread_t *)(plVar24 + 2),(pthread_attr_t *)0x0,
                                       pulseaudio_callback,__arg), iVar8 != 0)) {
              (this->super_RtApi).stream_.callbackInfo.isRunning = false;
              std::__cxx11::string::operator=
                        ((string *)&(this->super_RtApi).errorText_,
                         "RtApiPulse::probeDeviceOpen: error creating thread.");
              goto LAB_00110e23;
            }
          }
        }
LAB_00110ea1:
        bVar25 = (byte)uVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)streamName._M_dataplus._M_p != &streamName.field_2) {
          operator_delete(streamName._M_dataplus._M_p);
        }
        goto LAB_0011082c;
      }
      pcVar9 = (char *)(this->super_RtApi).errorText_._M_string_length;
      pcVar12 = "PulseAudio device does not support requested output channel count.";
    }
  }
  else {
    pcVar9 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar12 = "PulseAudio does not support channel offset mapping.";
  }
  bVar25 = 0;
  std::__cxx11::string::_M_replace((ulong)&(this->super_RtApi).errorText_,0,pcVar9,(ulong)pcVar12);
LAB_0011082c:
  return (bool)(bVar25 & 1);
}

Assistant:

bool RtApiPulse::probeDeviceOpen( unsigned int deviceId, StreamMode mode,
                                  unsigned int channels, unsigned int firstChannel,
                                  unsigned int sampleRate, RtAudioFormat format,
                                  unsigned int *bufferSize, RtAudio::StreamOptions *options )
{
  PulseAudioHandle *pah = 0;
  unsigned long bufferBytes = 0;
  pa_sample_spec ss;

  int deviceIdx = -1;
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId ) {
      deviceIdx = m;
      break;
    }
  }

  if ( deviceIdx < 0 ) return false;

  if ( firstChannel != 0 ) {
    errorText_ = "PulseAudio does not support channel offset mapping.";
    return false;
  }

  // These may be NULL for default devices but we already have the names.
  const char *dev_input = NULL;
  const char *dev_output = NULL;
  if ( !paDeviceList_[deviceIdx].sourceName.empty() )
    dev_input = paDeviceList_[deviceIdx].sourceName.c_str();
  if ( !paDeviceList_[deviceIdx].sinkName.empty() )
    dev_output = paDeviceList_[deviceIdx].sinkName.c_str();

  if ( mode==INPUT && deviceList_[deviceIdx].inputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested input channel count.";
    return false;
  }
  if ( mode==OUTPUT && deviceList_[deviceIdx].outputChannels < channels ) {
    errorText_ = "PulseAudio device does not support requested output channel count.";
    return false;
  }

  ss.channels = channels;

  bool sr_found = false;
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr ) {
    if ( sampleRate == *sr ) {
      sr_found = true;
      stream_.sampleRate = sampleRate;
      ss.rate = sampleRate;
      break;
    }
  }
  if ( !sr_found ) {
    stream_.sampleRate = sampleRate;
    ss.rate = sampleRate;
  }

  bool sf_found = 0;
  for ( const rtaudio_pa_format_mapping_t *sf = supported_sampleformats;
        sf->rtaudio_format && sf->pa_format != PA_SAMPLE_INVALID; ++sf ) {
    if ( format == sf->rtaudio_format ) {
      sf_found = true;
      stream_.userFormat = sf->rtaudio_format;
      stream_.deviceFormat[mode] = stream_.userFormat;
      ss.format = sf->pa_format;
      break;
    }
  }
  if ( !sf_found ) { // Use internal data format conversion.
    stream_.userFormat = format;
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    ss.format = PA_SAMPLE_FLOAT32LE;
  }

  // Set other stream parameters.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) stream_.userInterleaved = false;
  else stream_.userInterleaved = true;
  stream_.deviceInterleaved[mode] = true;
  stream_.nBuffers = options ? options->numberOfBuffers : 1;
  stream_.doByteSwap[mode] = false;
  stream_.nUserChannels[mode] = channels;
  stream_.nDeviceChannels[mode] = channels + firstChannel;
  stream_.channelOffset[mode] = 0;
  std::string streamName = "RtAudio";

  // Set flags for buffer conversion.
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] )
    stream_.doConvertBuffer[mode] = true;

  // Allocate necessary internal buffers.
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiPulse::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }
  stream_.bufferSize = *bufferSize;

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiPulse::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.deviceId[mode] = deviceIdx;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  if ( !stream_.apiHandle ) {
    PulseAudioHandle *pah = new PulseAudioHandle;
    if ( !pah ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error allocating memory for handle.";
      goto error;
    }

    stream_.apiHandle = pah;
    if ( pthread_cond_init( &pah->runnable_cv, NULL ) != 0 ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error creating condition variable.";
      goto error;
    }
  }
  pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  int error;
  if ( options && !options->streamName.empty() ) streamName = options->streamName;
  switch ( mode ) {
    pa_buffer_attr buffer_attr;
  case INPUT:
    buffer_attr.fragsize = bufferBytes;
    if ( options && options->numberOfBuffers > 0 )
      buffer_attr.maxlength = bufferBytes * (options->numberOfBuffers + 1);
    else
      buffer_attr.maxlength = bufferBytes * 4;

    pah->s_rec = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_RECORD,
                                dev_input, "Record", &ss, NULL, &buffer_attr, &error );
    if ( !pah->s_rec ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting input to PulseAudio server.";
      goto error;
    }
    break;
  case OUTPUT: {
    pa_buffer_attr * attr_ptr;

    if ( options && options->numberOfBuffers > 0 ) {
      // pa_buffer_attr::fragsize is recording-only.
      // Hopefully PortAudio won't access uninitialized fields.
      buffer_attr.maxlength = bufferBytes * options->numberOfBuffers;
      buffer_attr.minreq = -1;
      buffer_attr.prebuf = -1;
      buffer_attr.tlength = -1;
      attr_ptr = &buffer_attr;
    } else {
      attr_ptr = nullptr;
    }

    pah->s_play = pa_simple_new( NULL, streamName.c_str(), PA_STREAM_PLAYBACK,
                                 dev_output, "Playback", &ss, NULL, attr_ptr, &error );
    if ( !pah->s_play ) {
      errorText_ = "RtApiPulse::probeDeviceOpen: error connecting output to PulseAudio server.";
      goto error;
    }
    break;
  }
  case DUPLEX:
    /* Note: We could add DUPLEX by synchronizing multiple streams,
       but it would mean moving from Simple API to Asynchronous API:
       https://freedesktop.org/software/pulseaudio/doxygen/streams.html#sync_streams */
    errorText_ = "RtApiPulse::probeDeviceOpen: duplex not supported for PulseAudio.";
    goto error;
  default:
    goto error;
  }

  if ( stream_.mode == UNINITIALIZED )
    stream_.mode = mode;
  else if ( stream_.mode == mode )
    goto error;
  else
    stream_.mode = DUPLEX;

  if ( !stream_.callbackInfo.isRunning ) {
    stream_.callbackInfo.object = this;
    
    stream_.state = STREAM_STOPPED;
    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;
      
      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    int result = pthread_create( &pah->thread, &attr, pulseaudio_callback, (void *)&stream_.callbackInfo);
    pthread_attr_destroy(&attr);
    if(result != 0) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &pah->thread, NULL, pulseaudio_callback, (void *)&stream_.callbackInfo);
      if(result != 0) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiPulse::probeDeviceOpen: error creating thread.";
        goto error;
      }
    }
  }

  return SUCCESS;
 
 error:
  if ( pah && stream_.callbackInfo.isRunning ) {
    pthread_cond_destroy( &pah->runnable_cv );
    delete pah;
    stream_.apiHandle = 0;
  }

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}